

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiWindowSettings * ImGui::FindWindowSettings(ImGuiID id)

{
  ImGuiWindowSettings *pIVar1;
  ImGuiWindowSettings *pIVar2;
  ImGuiWindowSettings *pIVar3;
  
  pIVar1 = (ImGuiWindowSettings *)(GImGui->SettingsWindows).Buf.Data;
  pIVar2 = (ImGuiWindowSettings *)&pIVar1->Pos;
  pIVar3 = pIVar1;
  if (pIVar1 != (ImGuiWindowSettings *)0x0) {
    while (pIVar3 = pIVar2, pIVar2->ID != id) {
      pIVar2 = (ImGuiWindowSettings *)((long)&pIVar2->ID + (long)*(int *)&pIVar2[-1].Collapsed);
      if (pIVar2 == (ImGuiWindowSettings *)
                    ((long)&(pIVar1->Pos).x + (long)(GImGui->SettingsWindows).Buf.Size)) {
        return (ImGuiWindowSettings *)0x0;
      }
    }
  }
  return pIVar3;
}

Assistant:

ImGuiWindowSettings* ImGui::FindWindowSettings(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
        if (settings->ID == id)
            return settings;
    return NULL;
}